

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O1

void __thiscall
Rml::ControlledLifetimeResource<Rml::CoreData>::Shutdown
          (ControlledLifetimeResource<Rml::CoreData> *this)

{
  CoreData *pCVar1;
  TextInputHandler *pTVar2;
  FontEngineInterface *pFVar3;
  FileInterface *pFVar4;
  _Head_base<0UL,_Rml::SystemInterface_*,_false> _Var5;
  code *pcVar6;
  bool bVar7;
  pointer *__ptr;
  
  if (this->pointer == (CoreData *)0x0) {
    bVar7 = Assert("Shutting down resource that was not initialized, or has been shut down already."
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3e);
    if (!bVar7) goto LAB_001f05af;
  }
  if (this->intentionally_leaked == true) {
    bVar7 = Assert("Shutting down resource that was marked as leaked.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3f);
    if (!bVar7) {
LAB_001f05af:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
  }
  pCVar1 = this->pointer;
  if (pCVar1 != (CoreData *)0x0) {
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::destroy(&pCVar1->contexts);
    ::std::
    vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>
    ::~vector(&(pCVar1->render_managers).m_container);
    pTVar2 = (pCVar1->default_text_input_handler)._M_t.
             super___uniq_ptr_impl<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::TextInputHandler_*,_std::default_delete<Rml::TextInputHandler>_>
             .super__Head_base<0UL,_Rml::TextInputHandler_*,_false>._M_head_impl;
    if (pTVar2 != (TextInputHandler *)0x0) {
      (*pTVar2->_vptr_TextInputHandler[1])();
    }
    (pCVar1->default_text_input_handler)._M_t.
    super___uniq_ptr_impl<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>._M_t.
    super__Tuple_impl<0UL,_Rml::TextInputHandler_*,_std::default_delete<Rml::TextInputHandler>_>.
    super__Head_base<0UL,_Rml::TextInputHandler_*,_false>._M_head_impl = (TextInputHandler *)0x0;
    pFVar3 = (pCVar1->default_font_interface)._M_t.
             super___uniq_ptr_impl<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::FontEngineInterface_*,_std::default_delete<Rml::FontEngineInterface>_>
             .super__Head_base<0UL,_Rml::FontEngineInterface_*,_false>._M_head_impl;
    if (pFVar3 != (FontEngineInterface *)0x0) {
      (*pFVar3->_vptr_FontEngineInterface[1])();
    }
    (pCVar1->default_font_interface)._M_t.
    super___uniq_ptr_impl<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>.
    _M_t.
    super__Tuple_impl<0UL,_Rml::FontEngineInterface_*,_std::default_delete<Rml::FontEngineInterface>_>
    .super__Head_base<0UL,_Rml::FontEngineInterface_*,_false>._M_head_impl =
         (FontEngineInterface *)0x0;
    pFVar4 = (pCVar1->default_file_interface)._M_t.
             super___uniq_ptr_impl<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::FileInterface_*,_std::default_delete<Rml::FileInterface>_>.
             super__Head_base<0UL,_Rml::FileInterface_*,_false>._M_head_impl;
    if (pFVar4 != (FileInterface *)0x0) {
      (*pFVar4->_vptr_FileInterface[1])();
    }
    (pCVar1->default_file_interface)._M_t.
    super___uniq_ptr_impl<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>._M_t.
    super__Tuple_impl<0UL,_Rml::FileInterface_*,_std::default_delete<Rml::FileInterface>_>.
    super__Head_base<0UL,_Rml::FileInterface_*,_false>._M_head_impl = (FileInterface *)0x0;
    _Var5._M_head_impl =
         (pCVar1->default_system_interface)._M_t.
         super___uniq_ptr_impl<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>.
         _M_t.
         super__Tuple_impl<0UL,_Rml::SystemInterface_*,_std::default_delete<Rml::SystemInterface>_>.
         super__Head_base<0UL,_Rml::SystemInterface_*,_false>._M_head_impl;
    if (_Var5._M_head_impl != (SystemInterface *)0x0) {
      (*(_Var5._M_head_impl)->_vptr_SystemInterface[1])();
    }
    (pCVar1->default_system_interface)._M_t.
    super___uniq_ptr_impl<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>._M_t.
    super__Tuple_impl<0UL,_Rml::SystemInterface_*,_std::default_delete<Rml::SystemInterface>_>.
    super__Head_base<0UL,_Rml::SystemInterface_*,_false>._M_head_impl = (SystemInterface *)0x0;
    operator_delete(pCVar1,0x68);
  }
  this->pointer = (CoreData *)0x0;
  return;
}

Assistant:

void Shutdown()
	{
		RMLUI_ASSERTMSG(pointer, "Shutting down resource that was not initialized, or has been shut down already.");
		RMLUI_ASSERTMSG(!intentionally_leaked, "Shutting down resource that was marked as leaked.");
		delete pointer;
		pointer = nullptr;
	}